

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.cc
# Opt level: O0

void __thiscall
google::protobuf::internal::DynamicMapField::SyncMapWithRepeatedFieldNoLock(DynamicMapField *this)

{
  bool bVar1;
  byte bVar2;
  int iVar3;
  CppType CVar4;
  int32 value_00;
  uint32 value_01;
  undefined4 uVar5;
  undefined4 extraout_var;
  Descriptor *pDVar6;
  FieldDescriptor *pFVar7;
  reference pMVar8;
  int64 value_02;
  uint64 value_03;
  LogMessage *other;
  pointer pvVar9;
  MapValueRef *this_00;
  double dVar10;
  string *this_01;
  undefined4 *val;
  long *plVar11;
  long *val_00;
  undefined8 uVar12;
  Message *value_9;
  Message *message;
  int32 *value_8;
  string *local_1b8;
  string *value_7;
  bool *value_6;
  float *value_5;
  double *value_4;
  uint64 *value_3;
  uint32 *value_2;
  int64 *value_1;
  int32 *value;
  MapValueRef *map_val;
  undefined1 local_158 [8];
  iterator iter_1;
  LogMessage local_138;
  string local_100;
  undefined1 local_e0 [8];
  MapKey map_key;
  RepeatedPtrIterator<google::protobuf::Message> local_c8;
  iterator it;
  undefined1 local_a8 [8];
  iterator iter;
  string local_88;
  FieldDescriptor *local_68;
  FieldDescriptor *val_des;
  allocator local_49;
  string local_48;
  FieldDescriptor *local_28;
  FieldDescriptor *key_des;
  Reflection *reflection;
  Map<google::protobuf::MapKey,_google::protobuf::MapValueRef> *map;
  DynamicMapField *this_local;
  
  reflection = (Reflection *)&this->map_;
  map = (Map<google::protobuf::MapKey,_google::protobuf::MapValueRef> *)this;
  iVar3 = (*(this->default_entry_->super_MessageLite)._vptr_MessageLite[0x16])();
  key_des = (FieldDescriptor *)CONCAT44(extraout_var,iVar3);
  pDVar6 = Message::GetDescriptor(this->default_entry_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_48,"key",&local_49);
  pFVar7 = Descriptor::FindFieldByName(pDVar6,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  local_28 = pFVar7;
  pDVar6 = Message::GetDescriptor(this->default_entry_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_88,"value",(allocator *)((long)&iter.it_.bucket_index_ + 7));
  pFVar7 = Descriptor::FindFieldByName(pDVar6,&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  std::allocator<char>::~allocator((allocator<char> *)((long)&iter.it_.bucket_index_ + 7));
  local_68 = pFVar7;
  Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::begin
            ((iterator *)local_a8,
             (Map<google::protobuf::MapKey,_google::protobuf::MapValueRef> *)reflection);
  while( true ) {
    Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::end
              ((iterator *)&it,
               (Map<google::protobuf::MapKey,_google::protobuf::MapValueRef> *)reflection);
    bVar1 = protobuf::operator!=((iterator *)local_a8,(iterator *)&it);
    if (!bVar1) break;
    pvVar9 = Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::iterator::operator->
                       ((iterator *)local_a8);
    MapValueRef::DeleteData(&pvVar9->second);
    Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::iterator::operator++
              ((iterator *)local_a8);
  }
  Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::clear
            ((Map<google::protobuf::MapKey,_google::protobuf::MapValueRef> *)reflection);
  local_c8.it_ = (void **)RepeatedPtrField<google::protobuf::Message>::begin
                                    ((this->
                                     super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>
                                     ).super_MapFieldBase.repeated_field_);
  while( true ) {
    map_key._8_8_ =
         RepeatedPtrField<google::protobuf::Message>::end
                   ((this->
                    super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>
                    ).super_MapFieldBase.repeated_field_);
    bVar1 = RepeatedPtrIterator<google::protobuf::Message>::operator!=
                      (&local_c8,(iterator *)&map_key.type_);
    if (!bVar1) break;
    MapKey::MapKey((MapKey *)local_e0);
    CVar4 = FieldDescriptor::cpp_type(local_28);
    pFVar7 = key_des;
    switch(CVar4) {
    case CPPTYPE_INT32:
      pMVar8 = RepeatedPtrIterator<google::protobuf::Message>::operator*(&local_c8);
      value_00 = (**(code **)(*(long *)pFVar7 + 0x88))(pFVar7,pMVar8,local_28);
      MapKey::SetInt32Value((MapKey *)local_e0,value_00);
      break;
    case CPPTYPE_INT64:
      pMVar8 = RepeatedPtrIterator<google::protobuf::Message>::operator*(&local_c8);
      value_02 = (**(code **)(*(long *)pFVar7 + 0x90))(pFVar7,pMVar8,local_28);
      MapKey::SetInt64Value((MapKey *)local_e0,value_02);
      break;
    case CPPTYPE_UINT32:
      pMVar8 = RepeatedPtrIterator<google::protobuf::Message>::operator*(&local_c8);
      value_01 = (**(code **)(*(long *)pFVar7 + 0x98))(pFVar7,pMVar8,local_28);
      MapKey::SetUInt32Value((MapKey *)local_e0,value_01);
      break;
    case CPPTYPE_UINT64:
      pMVar8 = RepeatedPtrIterator<google::protobuf::Message>::operator*(&local_c8);
      value_03 = (**(code **)(*(long *)pFVar7 + 0xa0))(pFVar7,pMVar8,local_28);
      MapKey::SetUInt64Value((MapKey *)local_e0,value_03);
      break;
    case CPPTYPE_DOUBLE:
    case CPPTYPE_FLOAT:
    case CPPTYPE_ENUM:
    case CPPTYPE_MESSAGE:
      LogMessage::LogMessage
                (&local_138,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/map_field.cc"
                 ,0x16e);
      other = LogMessage::operator<<(&local_138,"Can\'t get here.");
      LogFinisher::operator=((LogFinisher *)((long)&iter_1.it_.bucket_index_ + 7),other);
      LogMessage::~LogMessage(&local_138);
      break;
    case CPPTYPE_BOOL:
      pMVar8 = RepeatedPtrIterator<google::protobuf::Message>::operator*(&local_c8);
      bVar2 = (**(code **)(*(long *)pFVar7 + 0xb8))(pFVar7,pMVar8,local_28);
      MapKey::SetBoolValue((MapKey *)local_e0,(bool)(bVar2 & 1));
      break;
    case CPPTYPE_STRING:
      pMVar8 = RepeatedPtrIterator<google::protobuf::Message>::operator*(&local_c8);
      (**(code **)(*(long *)pFVar7 + 0xc0))(&local_100,pFVar7,pMVar8,local_28);
      MapKey::SetStringValue((MapKey *)local_e0,&local_100);
      std::__cxx11::string::~string((string *)&local_100);
    }
    Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::find
              ((iterator *)local_158,
               (Map<google::protobuf::MapKey,_google::protobuf::MapValueRef> *)reflection,
               (key_type *)local_e0);
    Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::end
              ((iterator *)&map_val,
               (Map<google::protobuf::MapKey,_google::protobuf::MapValueRef> *)reflection);
    bVar1 = protobuf::operator!=((iterator *)local_158,(iterator *)&map_val);
    if (bVar1) {
      pvVar9 = Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::iterator::operator->
                         ((iterator *)local_158);
      MapValueRef::DeleteData(&pvVar9->second);
    }
    this_00 = Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::operator[]
                        ((Map<google::protobuf::MapKey,_google::protobuf::MapValueRef> *)reflection,
                         (key_type *)local_e0);
    value = (int32 *)this_00;
    CVar4 = FieldDescriptor::cpp_type(local_68);
    MapValueRef::SetType(this_00,CVar4);
    CVar4 = FieldDescriptor::cpp_type(local_68);
    pFVar7 = key_des;
    switch(CVar4) {
    case CPPTYPE_INT32:
      value_1 = (int64 *)operator_new(4);
      pFVar7 = key_des;
      pMVar8 = RepeatedPtrIterator<google::protobuf::Message>::operator*(&local_c8);
      uVar5 = (**(code **)(*(long *)pFVar7 + 0x88))(pFVar7,pMVar8,local_68);
      *(undefined4 *)value_1 = uVar5;
      MapValueRef::SetValue((MapValueRef *)value,value_1);
      break;
    case CPPTYPE_INT64:
      value_2 = (uint32 *)operator_new(8);
      pFVar7 = key_des;
      pMVar8 = RepeatedPtrIterator<google::protobuf::Message>::operator*(&local_c8);
      uVar12 = (**(code **)(*(long *)pFVar7 + 0x90))(pFVar7,pMVar8,local_68);
      *(undefined8 *)value_2 = uVar12;
      MapValueRef::SetValue((MapValueRef *)value,value_2);
      break;
    case CPPTYPE_UINT32:
      value_3 = (uint64 *)operator_new(4);
      pFVar7 = key_des;
      pMVar8 = RepeatedPtrIterator<google::protobuf::Message>::operator*(&local_c8);
      uVar5 = (**(code **)(*(long *)pFVar7 + 0x98))(pFVar7,pMVar8,local_68);
      *(undefined4 *)value_3 = uVar5;
      MapValueRef::SetValue((MapValueRef *)value,value_3);
      break;
    case CPPTYPE_UINT64:
      value_4 = (double *)operator_new(8);
      pFVar7 = key_des;
      pMVar8 = RepeatedPtrIterator<google::protobuf::Message>::operator*(&local_c8);
      dVar10 = (double)(**(code **)(*(long *)pFVar7 + 0xa0))(pFVar7,pMVar8,local_68);
      *value_4 = dVar10;
      MapValueRef::SetValue((MapValueRef *)value,value_4);
      break;
    case CPPTYPE_DOUBLE:
      value_5 = (float *)operator_new(8);
      pFVar7 = key_des;
      pMVar8 = RepeatedPtrIterator<google::protobuf::Message>::operator*(&local_c8);
      uVar12 = (**(code **)(*(long *)pFVar7 + 0xb0))(pFVar7,pMVar8,local_68);
      *(undefined8 *)value_5 = uVar12;
      MapValueRef::SetValue((MapValueRef *)value,value_5);
      break;
    case CPPTYPE_FLOAT:
      value_6 = (bool *)operator_new(4);
      pFVar7 = key_des;
      pMVar8 = RepeatedPtrIterator<google::protobuf::Message>::operator*(&local_c8);
      uVar5 = (**(code **)(*(long *)pFVar7 + 0xa8))(pFVar7,pMVar8,local_68);
      *(undefined4 *)value_6 = uVar5;
      MapValueRef::SetValue((MapValueRef *)value,value_6);
      break;
    case CPPTYPE_BOOL:
      value_7 = (string *)operator_new(1);
      pFVar7 = key_des;
      pMVar8 = RepeatedPtrIterator<google::protobuf::Message>::operator*(&local_c8);
      bVar2 = (**(code **)(*(long *)pFVar7 + 0xb8))(pFVar7,pMVar8,local_68);
      value_7->_M_dataplus = (_Alloc_hider)(bVar2 & 1);
      MapValueRef::SetValue((MapValueRef *)value,value_7);
      break;
    case CPPTYPE_ENUM:
      val = (undefined4 *)operator_new(4);
      pFVar7 = key_des;
      pMVar8 = RepeatedPtrIterator<google::protobuf::Message>::operator*(&local_c8);
      uVar5 = (**(code **)(*(long *)pFVar7 + 0xd0))(pFVar7,pMVar8,local_68);
      *val = uVar5;
      MapValueRef::SetValue((MapValueRef *)value,val);
      break;
    case CPPTYPE_STRING:
      this_01 = (string *)operator_new(0x20);
      std::__cxx11::string::string(this_01);
      pFVar7 = key_des;
      local_1b8 = this_01;
      pMVar8 = RepeatedPtrIterator<google::protobuf::Message>::operator*(&local_c8);
      (**(code **)(*(long *)pFVar7 + 0xc0))(&value_8,pFVar7,pMVar8,local_68);
      std::__cxx11::string::operator=(local_1b8,(string *)&value_8);
      std::__cxx11::string::~string((string *)&value_8);
      MapValueRef::SetValue((MapValueRef *)value,local_1b8);
      break;
    case CPPTYPE_MESSAGE:
      pMVar8 = RepeatedPtrIterator<google::protobuf::Message>::operator*(&local_c8);
      plVar11 = (long *)(**(code **)(*(long *)pFVar7 + 0xd8))(pFVar7,pMVar8,local_68,0);
      val_00 = (long *)(**(code **)(*plVar11 + 0x18))();
      (**(code **)(*val_00 + 0x88))(val_00,plVar11);
      MapValueRef::SetValue((MapValueRef *)value,val_00);
    }
    MapKey::~MapKey((MapKey *)local_e0);
    RepeatedPtrIterator<google::protobuf::Message>::operator++(&local_c8);
  }
  return;
}

Assistant:

void DynamicMapField::SyncMapWithRepeatedFieldNoLock() const {
  Map<MapKey, MapValueRef>* map = &const_cast<DynamicMapField*>(this)->map_;
  const Reflection* reflection = default_entry_->GetReflection();
  const FieldDescriptor* key_des =
      default_entry_->GetDescriptor()->FindFieldByName("key");
  const FieldDescriptor* val_des =
      default_entry_->GetDescriptor()->FindFieldByName("value");
  // DynamicMapField owns map values. Need to delete them before clearing
  // the map.
  for (Map<MapKey, MapValueRef>::iterator iter = map->begin();
       iter != map->end(); ++iter) {
    iter->second.DeleteData();
  }
  map->clear();
  for (RepeatedPtrField<Message>::iterator it =
           MapFieldBase::repeated_field_->begin();
       it != MapFieldBase::repeated_field_->end(); ++it) {
    MapKey map_key;
    switch (key_des->cpp_type()) {
      case google::protobuf::FieldDescriptor::CPPTYPE_STRING:
        map_key.SetStringValue(reflection->GetString(*it, key_des));
        break;
      case google::protobuf::FieldDescriptor::CPPTYPE_INT64:
        map_key.SetInt64Value(reflection->GetInt64(*it, key_des));
        break;
      case google::protobuf::FieldDescriptor::CPPTYPE_INT32:
        map_key.SetInt32Value(reflection->GetInt32(*it, key_des));
        break;
      case google::protobuf::FieldDescriptor::CPPTYPE_UINT64:
        map_key.SetUInt64Value(reflection->GetUInt64(*it, key_des));
        break;
      case google::protobuf::FieldDescriptor::CPPTYPE_UINT32:
        map_key.SetUInt32Value(reflection->GetUInt32(*it, key_des));
        break;
      case google::protobuf::FieldDescriptor::CPPTYPE_BOOL:
        map_key.SetBoolValue(reflection->GetBool(*it, key_des));
        break;
      case google::protobuf::FieldDescriptor::CPPTYPE_DOUBLE:
      case google::protobuf::FieldDescriptor::CPPTYPE_FLOAT:
      case google::protobuf::FieldDescriptor::CPPTYPE_ENUM:
      case google::protobuf::FieldDescriptor::CPPTYPE_MESSAGE:
        GOOGLE_LOG(FATAL) << "Can't get here.";
        break;
    }

    // Remove existing map value with same key.
    Map<MapKey, MapValueRef>::iterator iter = map->find(map_key);
    if (iter != map->end()) {
      iter->second.DeleteData();
    }

    MapValueRef& map_val = (*map)[map_key];
    map_val.SetType(val_des->cpp_type());
    switch (val_des->cpp_type()) {
#define HANDLE_TYPE(CPPTYPE, TYPE, METHOD)                      \
      case google::protobuf::FieldDescriptor::CPPTYPE_##CPPTYPE: {        \
        TYPE * value = new TYPE;                                \
        *value = reflection->Get##METHOD(*it, val_des);         \
            map_val.SetValue(value);                            \
            break;                                              \
      }
      HANDLE_TYPE(INT32, int32, Int32);
      HANDLE_TYPE(INT64, int64, Int64);
      HANDLE_TYPE(UINT32, uint32, UInt32);
      HANDLE_TYPE(UINT64, uint64, UInt64);
      HANDLE_TYPE(DOUBLE, double, Double);
      HANDLE_TYPE(FLOAT, float, Float);
      HANDLE_TYPE(BOOL, bool, Bool);
      HANDLE_TYPE(STRING, string, String);
      HANDLE_TYPE(ENUM, int32, EnumValue);
#undef HANDLE_TYPE
      case google::protobuf::FieldDescriptor::CPPTYPE_MESSAGE: {
        const Message& message = reflection->GetMessage(*it, val_des);
        Message* value = message.New();
        value->CopyFrom(message);
        map_val.SetValue(value);
        break;
      }
    }
  }
}